

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall
wabt::interp::Thread::DoSimdReplace<wabt::interp::Simd<float,(unsigned_char)4>,float>
          (Thread *this,Instr instr)

{
  Simd<float,_(unsigned_char)__x04_> value;
  Simd<float,_(unsigned_char)__x04_> SVar1;
  Simd<float,_(unsigned_char)__x04_> simd;
  float val;
  Thread *this_local;
  
  unique0x10000127 = this;
  simd.v[2] = Pop<float>(this);
  SVar1 = Pop<wabt::interp::Simd<float,(unsigned_char)4>>(this);
  simd.v._0_8_ = SVar1.v._8_8_;
  simd.v[(ulong)instr.field_2.imm_u8 - 2] = simd.v[2];
  value.v[2] = simd.v[0];
  value.v[3] = simd.v[1];
  value.v[0] = (float)(int)SVar1.v._0_8_;
  value.v[1] = (float)(int)((ulong)SVar1.v._0_8_ >> 0x20);
  Push<wabt::interp::Simd<float,(unsigned_char)4>>(this,value);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdReplace(Instr instr) {
  auto val = Pop<T>();
  auto simd = Pop<R>();
  simd.v[instr.imm_u8] = val;
  Push(simd);
  return RunResult::Ok;
}